

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d4e6f::AEADTest_WycheproofXChaCha20Poly1305_Test::TestBody
          (AEADTest_WycheproofXChaCha20Poly1305_Test *this)

{
  anon_class_1_0_00000001 local_31;
  function<void_(FileTest_*)> local_30;
  AEADTest_WycheproofXChaCha20Poly1305_Test *local_10;
  AEADTest_WycheproofXChaCha20Poly1305_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::
  function<(anonymous_namespace)::AEADTest_WycheproofXChaCha20Poly1305_Test::TestBody()::__0,void>
            ((function<void(FileTest*)> *)&local_30,&local_31);
  FileTestGTest("third_party/wycheproof_testvectors/xchacha20_poly1305_test.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(AEADTest, WycheproofXChaCha20Poly1305) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/xchacha20_poly1305_test.txt",
      [](FileTest *t) {
        t->IgnoreInstruction("keySize");
        RunWycheproofTestCase(t, EVP_aead_xchacha20_poly1305());
      });
}